

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

bool Random_SanityCheck(void)

{
  undefined4 uVar1;
  ulong uVar2;
  undefined1 auVar3 [13];
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  uint5 uVar19;
  undefined1 auVar20 [13];
  long lVar21;
  undefined4 extraout_var;
  int *piVar22;
  RNGState *this;
  uint uVar23;
  long in_FS_OFFSET;
  bool bVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint64_t stop;
  uint64_t start;
  CSHA512 to_add;
  bool overwritten [32];
  uint8_t data [32];
  ulong local_130;
  ulong local_128;
  CSHA512 local_120;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = rdtsc();
  local_128 = uVar2 & 0xffffffff00000000 | CONCAT44((int)((ulong)local_18 >> 0x20),(int)uVar2);
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  uVar23 = 0;
  do {
    local_28 = (undefined1  [16])0x0;
    local_38 = (undefined1  [16])0x0;
    anon_unknown.dwarf_5dcce5::GetOSRand(local_38);
    lVar21 = 0;
    do {
      cVar4 = local_38[lVar21 + 1];
      cVar5 = local_38[lVar21 + 2];
      cVar6 = local_38[lVar21 + 3];
      cVar7 = local_38[lVar21 + 4];
      cVar8 = local_38[lVar21 + 5];
      cVar9 = local_38[lVar21 + 6];
      cVar10 = local_38[lVar21 + 7];
      cVar11 = local_38[lVar21 + 8];
      cVar12 = local_38[lVar21 + 9];
      cVar13 = local_38[lVar21 + 10];
      cVar14 = local_38[lVar21 + 0xb];
      cVar15 = local_38[lVar21 + 0xc];
      cVar16 = local_38[lVar21 + 0xd];
      cVar17 = local_38[lVar21 + 0xe];
      cVar18 = local_38[lVar21 + 0xf];
      local_58[lVar21] = ~-(local_38[lVar21] == '\0') & 1U | local_58[lVar21];
      local_58[lVar21 + 1] = ~-(cVar4 == '\0') & 1U | local_58[lVar21 + 1];
      local_58[lVar21 + 2] = ~-(cVar5 == '\0') & 1U | local_58[lVar21 + 2];
      local_58[lVar21 + 3] = ~-(cVar6 == '\0') & 1U | local_58[lVar21 + 3];
      local_58[lVar21 + 4] = ~-(cVar7 == '\0') & 1U | local_58[lVar21 + 4];
      local_58[lVar21 + 5] = ~-(cVar8 == '\0') & 1U | local_58[lVar21 + 5];
      local_58[lVar21 + 6] = ~-(cVar9 == '\0') & 1U | local_58[lVar21 + 6];
      local_58[lVar21 + 7] = ~-(cVar10 == '\0') & 1U | local_58[lVar21 + 7];
      local_58[lVar21 + 8] = ~-(cVar11 == '\0') & 1U | local_58[lVar21 + 8];
      local_58[lVar21 + 9] = ~-(cVar12 == '\0') & 1U | local_58[lVar21 + 9];
      local_58[lVar21 + 10] = ~-(cVar13 == '\0') & 1U | local_58[lVar21 + 10];
      local_58[lVar21 + 0xb] = ~-(cVar14 == '\0') & 1U | local_58[lVar21 + 0xb];
      local_58[lVar21 + 0xc] = ~-(cVar15 == '\0') & 1U | local_58[lVar21 + 0xc];
      local_58[lVar21 + 0xd] = ~-(cVar16 == '\0') & 1U | local_58[lVar21 + 0xd];
      local_58[lVar21 + 0xe] = ~-(cVar17 == '\0') & 1U | local_58[lVar21 + 0xe];
      local_58[lVar21 + 0xf] = ~-(cVar18 == '\0') & 1U | local_58[lVar21 + 0xf];
      lVar21 = lVar21 + 0x10;
    } while (lVar21 != 0x20);
    iVar25 = 0;
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    lVar21 = 0;
    do {
      uVar1 = *(undefined4 *)(local_58 + lVar21);
      auVar3[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3._0_12_ = ZEXT812(0);
      uVar19 = CONCAT32(auVar3._10_3_,(ushort)(byte)((uint)uVar1 >> 0x10));
      auVar20._5_8_ = 0;
      auVar20._0_5_ = uVar19;
      iVar25 = iVar25 + (uint)((ushort)uVar1 & 0xff);
      iVar27 = iVar27 + (int)CONCAT72(SUB137(auVar20 << 0x40,6),(ushort)(byte)((uint)uVar1 >> 8));
      iVar28 = iVar28 + (int)uVar19;
      iVar29 = iVar29 + (uint)(uint3)(auVar3._10_3_ >> 0x10);
      lVar21 = lVar21 + 4;
    } while (lVar21 != 0x20);
    uVar26 = iVar29 + iVar27 + iVar28 + iVar25;
  } while ((uVar26 < 0x20) && (bVar24 = uVar23 < 0x3ff, uVar23 = uVar23 + 1, bVar24));
  if (uVar26 == 0x20) {
    local_120.s[0] = 0;
    local_120.s[1] = 1000000;
    do {
      iVar25 = nanosleep((timespec *)&local_120,(timespec *)&local_120);
      piVar22 = (int *)CONCAT44(extraout_var,iVar25);
      if (iVar25 != -1) break;
      piVar22 = __errno_location();
    } while (*piVar22 == 4);
    uVar2 = rdtsc();
    local_130 = uVar2 & 0xffffffff00000000 | CONCAT44((int)((ulong)piVar22 >> 0x20),(int)uVar2);
    bVar24 = local_130 != local_128;
    if (bVar24) {
      CSHA512::CSHA512(&local_120);
      CSHA512::Write(&local_120,(uchar *)&local_128,8);
      CSHA512::Write(&local_120,(uchar *)&local_130,8);
      this = anon_unknown.dwarf_5dcce5::GetRNGState();
      anon_unknown.dwarf_5dcce5::RNGState::MixExtract(this,(uchar *)0x0,0,&local_120,false,true);
    }
  }
  else {
    bVar24 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar24;
  }
  __stack_chk_fail();
}

Assistant:

bool Random_SanityCheck()
{
    uint64_t start = GetPerformanceCounter();

    /* This does not measure the quality of randomness, but it does test that
     * GetOSRand() overwrites all 32 bytes of the output given a maximum
     * number of tries.
     */
    static constexpr int MAX_TRIES{1024};
    uint8_t data[NUM_OS_RANDOM_BYTES];
    bool overwritten[NUM_OS_RANDOM_BYTES] = {}; /* Tracks which bytes have been overwritten at least once */
    int num_overwritten;
    int tries = 0;
    /* Loop until all bytes have been overwritten at least once, or max number tries reached */
    do {
        memset(data, 0, NUM_OS_RANDOM_BYTES);
        GetOSRand(data);
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            overwritten[x] |= (data[x] != 0);
        }

        num_overwritten = 0;
        for (int x=0; x < NUM_OS_RANDOM_BYTES; ++x) {
            if (overwritten[x]) {
                num_overwritten += 1;
            }
        }

        tries += 1;
    } while (num_overwritten < NUM_OS_RANDOM_BYTES && tries < MAX_TRIES);
    if (num_overwritten != NUM_OS_RANDOM_BYTES) return false; /* If this failed, bailed out after too many tries */

    // Check that GetPerformanceCounter increases at least during a GetOSRand() call + 1ms sleep.
    std::this_thread::sleep_for(std::chrono::milliseconds(1));
    uint64_t stop = GetPerformanceCounter();
    if (stop == start) return false;

    // We called GetPerformanceCounter. Use it as entropy.
    CSHA512 to_add;
    to_add.Write((const unsigned char*)&start, sizeof(start));
    to_add.Write((const unsigned char*)&stop, sizeof(stop));
    GetRNGState().MixExtract(nullptr, 0, std::move(to_add), false, /*always_use_real_rng=*/true);

    return true;
}